

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MooDb.hpp
# Opt level: O0

void __thiscall Table::Save(Table *this,string *fileName)

{
  ulong uVar1;
  size_type sVar2;
  reference pvVar3;
  reference pvVar4;
  long lVar5;
  string local_600;
  allocator<char> local_5d9;
  string local_5d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_5b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_598;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_578;
  int local_558;
  allocator<char> local_551;
  int q;
  string rowData;
  undefined1 local_528 [4];
  int p_1;
  allocator<char> local_501;
  string local_500;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4e0;
  int local_4c0;
  allocator<char> local_4b9;
  int p;
  string tableColumns;
  string local_488;
  undefined1 local_468 [8];
  CowConfig cfg;
  string *fileName_local;
  Table *this_local;
  
  cfg.Lines.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = fileName;
  std::__cxx11::string::string((string *)&local_488,(string *)fileName);
  CowConfig::CowConfig((CowConfig *)local_468,&local_488);
  std::__cxx11::string::~string((string *)&local_488);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&p,"",&local_4b9);
  std::allocator<char>::~allocator(&local_4b9);
  local_4c0 = 0;
  while( true ) {
    uVar1 = (ulong)local_4c0;
    sVar2 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::size(&this->Columns);
    if (sVar2 <= uVar1) break;
    pvVar3 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[](&this->Columns,(long)local_4c0);
    std::operator+(&local_4e0,pvVar3,",");
    std::__cxx11::string::operator+=((string *)&p,(string *)&local_4e0);
    std::__cxx11::string::~string((string *)&local_4e0);
    local_4c0 = local_4c0 + 1;
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_500,"",&local_501);
  std::__cxx11::string::string((string *)local_528,(string *)&p);
  CowConfig::WriteLine((CowConfig *)local_468,&local_500,(string *)local_528);
  std::__cxx11::string::~string((string *)local_528);
  std::__cxx11::string::~string((string *)&local_500);
  std::allocator<char>::~allocator(&local_501);
  rowData.field_2._12_4_ = 0;
  while( true ) {
    uVar1 = (ulong)(int)rowData.field_2._12_4_;
    sVar2 = std::
            vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
            ::size(&this->Data);
    if (sVar2 <= uVar1) break;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&q,"",&local_551);
    std::allocator<char>::~allocator(&local_551);
    local_558 = 0;
    while( true ) {
      uVar1 = (ulong)local_558;
      pvVar4 = std::
               vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
               ::operator[](&this->Data,(long)(int)rowData.field_2._12_4_);
      sVar2 = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::size(pvVar4);
      if (sVar2 <= uVar1) break;
      pvVar4 = std::
               vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
               ::operator[](&this->Data,(long)(int)rowData.field_2._12_4_);
      pvVar3 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator[](pvVar4,(long)local_558);
      lVar5 = std::__cxx11::string::find((char *)pvVar3,0x10e150);
      if (lVar5 == -1) {
        pvVar4 = std::
                 vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                 ::operator[](&this->Data,(long)(int)rowData.field_2._12_4_);
        pvVar3 = std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::operator[](pvVar4,(long)local_558);
        std::operator+(&local_5b8,pvVar3,",");
        std::__cxx11::string::operator+=((string *)&q,(string *)&local_5b8);
        std::__cxx11::string::~string((string *)&local_5b8);
      }
      else {
        pvVar4 = std::
                 vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                 ::operator[](&this->Data,(long)(int)rowData.field_2._12_4_);
        pvVar3 = std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::operator[](pvVar4,(long)local_558);
        std::operator+(&local_598,"\"",pvVar3);
        std::operator+(&local_578,&local_598,"\",");
        std::__cxx11::string::operator+=((string *)&q,(string *)&local_578);
        std::__cxx11::string::~string((string *)&local_578);
        std::__cxx11::string::~string((string *)&local_598);
      }
      local_558 = local_558 + 1;
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_5d8,"",&local_5d9);
    std::__cxx11::string::string((string *)&local_600,(string *)&q);
    CowConfig::WriteLine((CowConfig *)local_468,&local_5d8,&local_600);
    std::__cxx11::string::~string((string *)&local_600);
    std::__cxx11::string::~string((string *)&local_5d8);
    std::allocator<char>::~allocator(&local_5d9);
    std::__cxx11::string::~string((string *)&q);
    rowData.field_2._12_4_ = rowData.field_2._12_4_ + 1;
  }
  std::__cxx11::string::~string((string *)&p);
  CowConfig::~CowConfig((CowConfig *)local_468);
  return;
}

Assistant:

void Save(std::string fileName){
		CowConfig cfg(fileName);
		std::string tableColumns = "";
		for (int p = 0; p < Columns.size(); p++)
			tableColumns += Columns[p] + ",";
		cfg.WriteLine("", tableColumns);

		for (int p = 0; p < Data.size(); p++){
			std::string rowData = "";
			for (int q = 0; q < Data[p].size(); q++){
				if (Data[p][q].find(",") != std::string::npos)
					rowData += "\"" + Data[p][q] + "\",";
				else
					rowData += Data[p][q] + ",";
			} // looping horizontally
			cfg.WriteLine("", rowData);
		} // looping vertically
	}